

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::TextureStateQueryTests::init
          (TextureStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  TestContext *pTVar2;
  Context *pCVar3;
  int iVar4;
  GetTexParameterIVerifier *pGVar5;
  undefined4 extraout_var;
  GetTexParameterFVerifier *pGVar6;
  undefined4 extraout_var_00;
  ApiCase *pAVar7;
  long *plVar8;
  long *plVar9;
  int _verifierNdx;
  long lVar10;
  long lVar11;
  TexParamVerifier *verifiers [2];
  allocator<char> local_b9;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  undefined **local_78;
  long *local_70 [2];
  long local_60 [2];
  TextureStateQueryTests *local_50;
  GetTexParameterIVerifier *local_48;
  GetTexParameterFVerifier *local_40;
  long local_38;
  
  pGVar5 = (GetTexParameterIVerifier *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar5->super_TexParamVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar5->super_TexParamVerifier).m_testNamePostfix = "_gettexparameteri";
  (pGVar5->super_TexParamVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar5->super_TexParamVerifier)._vptr_TexParamVerifier =
       (_func_int **)&PTR__TexParamVerifier_00791200;
  this->m_verifierInt = pGVar5;
  pGVar6 = (GetTexParameterFVerifier *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar6->super_TexParamVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_00,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar6->super_TexParamVerifier).m_testNamePostfix = "_gettexparameterf";
  (pGVar6->super_TexParamVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar6->super_TexParamVerifier)._vptr_TexParamVerifier =
       (_func_int **)&PTR__TexParamVerifier_00791230;
  this->m_verifierFloat = pGVar6;
  local_48 = this->m_verifierInt;
  local_40 = pGVar6;
  lVar11 = 0;
  local_50 = this;
  do {
    local_78 = &PTR_anon_var_dwarf_5c1d00_00791290 + lVar11 * 2;
    lVar10 = 0;
    local_38 = lVar11;
    do {
      pTVar2 = (TestContext *)(&local_48)[lVar10];
      pAVar7 = (ApiCase *)operator_new(0xb0);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,*local_78,&local_b9);
      plVar8 = (long *)std::__cxx11::string::append((char *)local_70);
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_a8 = *plVar9;
        lStack_a0 = plVar8[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar9;
        local_b8 = (long *)*plVar8;
      }
      local_b0 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_88 = *plVar9;
        lStack_80 = plVar8[3];
      }
      else {
        local_88 = *plVar9;
        local_98 = (long *)*plVar8;
      }
      local_90 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      uVar1 = *(undefined4 *)(local_78 + 1);
      ApiCase::ApiCase(pAVar7,pCVar3,(char *)local_98,"TEXTURE_WRAP_S");
      this = local_50;
      *(undefined4 *)&pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
      pAVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar2;
      (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00791330;
      *(undefined4 *)&pAVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p
           = 0x2802;
      tcu::TestNode::addChild((TestNode *)local_50,(TestNode *)pAVar7);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar11 = 0;
    do {
      pTVar2 = (TestContext *)(&local_48)[lVar11];
      pAVar7 = (ApiCase *)operator_new(0xb0);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,*local_78,&local_b9);
      plVar8 = (long *)std::__cxx11::string::append((char *)local_70);
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_a8 = *plVar9;
        lStack_a0 = plVar8[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar9;
        local_b8 = (long *)*plVar8;
      }
      local_b0 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_88 = *plVar9;
        lStack_80 = plVar8[3];
      }
      else {
        local_88 = *plVar9;
        local_98 = (long *)*plVar8;
      }
      local_90 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      uVar1 = *(undefined4 *)(local_78 + 1);
      ApiCase::ApiCase(pAVar7,pCVar3,(char *)local_98,"TEXTURE_WRAP_T");
      this = local_50;
      *(undefined4 *)&pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
      pAVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar2;
      (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00791330;
      *(undefined4 *)&pAVar7[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p
           = 0x2803;
      tcu::TestNode::addChild((TestNode *)local_50,(TestNode *)pAVar7);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
    lVar11 = 0;
    do {
      pTVar2 = (TestContext *)(&local_48)[lVar11];
      pAVar7 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,*local_78,&local_b9);
      plVar8 = (long *)std::__cxx11::string::append((char *)local_70);
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_a8 = *plVar9;
        lStack_a0 = plVar8[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar9;
        local_b8 = (long *)*plVar8;
      }
      local_b0 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_88 = *plVar9;
        lStack_80 = plVar8[3];
      }
      else {
        local_88 = *plVar9;
        local_98 = (long *)*plVar8;
      }
      local_90 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      uVar1 = *(undefined4 *)(local_78 + 1);
      ApiCase::ApiCase(pAVar7,pCVar3,(char *)local_98,"TEXTURE_MAG_FILTER");
      this = local_50;
      *(undefined4 *)&pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
      pAVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar2;
      (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_007913f0;
      tcu::TestNode::addChild((TestNode *)local_50,(TestNode *)pAVar7);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
    lVar11 = 0;
    do {
      pTVar2 = (TestContext *)(&local_48)[lVar11];
      pAVar7 = (ApiCase *)operator_new(0xa8);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,*local_78,&local_b9);
      plVar8 = (long *)std::__cxx11::string::append((char *)local_70);
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_a8 = *plVar9;
        lStack_a0 = plVar8[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar9;
        local_b8 = (long *)*plVar8;
      }
      local_b0 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_88 = *plVar9;
        lStack_80 = plVar8[3];
      }
      else {
        local_88 = *plVar9;
        local_98 = (long *)*plVar8;
      }
      local_90 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      uVar1 = *(undefined4 *)(local_78 + 1);
      ApiCase::ApiCase(pAVar7,pCVar3,(char *)local_98,"TEXTURE_MIN_FILTER");
      this = local_50;
      *(undefined4 *)&pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
      pAVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar2;
      (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00791450;
      tcu::TestNode::addChild((TestNode *)local_50,(TestNode *)pAVar7);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
    lVar11 = local_38 + 1;
  } while (local_38 == 0);
  return (int)lVar11;
}

Assistant:

void TextureStateQueryTests::init (void)
{
	using namespace TextureParamVerifiers;

	DE_ASSERT(m_verifierInt == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierInt		= new GetTexParameterIVerifier(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat		= new GetTexParameterFVerifier(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	TexParamVerifier* verifiers[] = {m_verifierInt, m_verifierFloat};

	const struct
	{
		const char*	name;
		GLenum		textureTarget;
	} textureTargets[] =
	{
		{ "texture_2d",			GL_TEXTURE_2D},
		{ "texture_cube_map",	GL_TEXTURE_CUBE_MAP}
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(textureTargets); ++ndx)
	{
		FOR_EACH_VERIFIER(verifiers, addChild(new TextureWrapCase		(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_wrap_s"			+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_WRAP_S",		textureTargets[ndx].textureTarget, GL_TEXTURE_WRAP_S)));
		FOR_EACH_VERIFIER(verifiers, addChild(new TextureWrapCase		(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_wrap_t"			+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_WRAP_T",		textureTargets[ndx].textureTarget, GL_TEXTURE_WRAP_T)));

		FOR_EACH_VERIFIER(verifiers, addChild(new TextureMagFilterCase	(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_mag_filter"		+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_MAG_FILTER",	textureTargets[ndx].textureTarget)));
		FOR_EACH_VERIFIER(verifiers, addChild(new TextureMinFilterCase	(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_min_filter"		+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_MIN_FILTER",	textureTargets[ndx].textureTarget)));
	}
}